

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjson.h
# Opt level: O2

void * __thiscall pjson::pool_allocator::Alloc(pool_allocator *this,size_t size)

{
  uint uVar1;
  chunk *pcVar2;
  uint uVar3;
  chunk *pcVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  
  uVar6 = size + 3 & 0xfffffffffffffffc;
  pcVar2 = this->m_pActive_chunks;
  if (pcVar2 != (chunk *)0x0) {
    sVar7 = pcVar2->m_size;
    sVar5 = pcVar2->m_ofs;
    pcVar4 = pcVar2;
    if (uVar6 <= sVar7 - sVar5) goto LAB_00105ba8;
  }
  pcVar4 = this->m_pFree_chunks;
  if ((pcVar4 == (chunk *)0x0) || (sVar7 = pcVar4->m_size, sVar7 < uVar6)) {
    uVar1 = this->m_cur_grow_size;
    sVar7 = (ulong)uVar1;
    if (uVar1 < uVar6) {
      sVar7 = uVar6;
    }
    uVar3 = 0x800000;
    if (uVar1 * 2 < 0x800000) {
      uVar3 = uVar1 * 2;
    }
    this->m_cur_grow_size = uVar3;
    pcVar4 = (chunk *)malloc(sVar7 + 0x18);
    pcVar4->m_size = sVar7;
    pcVar4->m_ofs = 0;
  }
  else {
    if (this->m_total_free_bytes < sVar7) {
      __assert_fail("m_total_free_bytes >= pNew_chunk->m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                    ,0xc9,"void *pjson::pool_allocator::Alloc(size_t)");
    }
    this->m_total_free_bytes = this->m_total_free_bytes - sVar7;
    this->m_pFree_chunks = pcVar4->m_pNext;
    if (pcVar4->m_ofs != 0) {
      __assert_fail("!pNew_chunk->m_ofs",
                    "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                    ,0xcc,"void *pjson::pool_allocator::Alloc(size_t)");
    }
  }
  pcVar4->m_pNext = pcVar2;
  this->m_pActive_chunks = pcVar4;
  sVar5 = 0;
LAB_00105ba8:
  pcVar4->m_ofs = uVar6 + sVar5;
  if (uVar6 + sVar5 <= sVar7) {
    return (void *)((long)&pcVar4[1].m_pNext + sVar5);
  }
  __assert_fail("m_pActive_chunks->m_ofs <= m_pActive_chunks->m_size",
                "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                ,0xdd,"void *pjson::pool_allocator::Alloc(size_t)");
}

Assistant:

inline void* Alloc(size_t size)
      {
         size = (size + 3) & ~3;
         if ((!m_pActive_chunks) || ((m_pActive_chunks->m_size - m_pActive_chunks->m_ofs) < size))
         {
            chunk* pNew_chunk = m_pFree_chunks;
            if ((pNew_chunk) && (pNew_chunk->m_size >= size))
            {
               PJSON_ASSERT(m_total_free_bytes >= pNew_chunk->m_size);
               m_total_free_bytes -= pNew_chunk->m_size;
               m_pFree_chunks = pNew_chunk->m_pNext;
               PJSON_ASSERT(!pNew_chunk->m_ofs);
            }
            else
            {
               size_t alloc_size = PJSON_MAX(size, m_cur_grow_size);
               m_cur_grow_size = PJSON_MIN(m_cur_grow_size * 2, PJSON_MAX_CHUNK_GROW_SIZE);

               pNew_chunk = static_cast<chunk*>(pjson_malloc(sizeof(chunk) + alloc_size));
               pNew_chunk->m_size = alloc_size;
               pNew_chunk->m_ofs = 0;
            }

            pNew_chunk->m_pNext = m_pActive_chunks;
            m_pActive_chunks = pNew_chunk;
         }
         void* pRet = (uint8*)m_pActive_chunks + sizeof(chunk) + m_pActive_chunks->m_ofs;
         m_pActive_chunks->m_ofs += size;
         PJSON_ASSERT(m_pActive_chunks->m_ofs <= m_pActive_chunks->m_size);
         return pRet;
      }